

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::DummyDataParameter::InternalSwap(DummyDataParameter *this,DummyDataParameter *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  void *pvVar5;
  UnknownFieldSet *pUVar6;
  UnknownFieldSet *pUVar7;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->data_filler_).super_RepeatedPtrFieldBase,
             &(other->data_filler_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<unsigned_int>::InternalSwap(&this->num_,&other->num_);
  google::protobuf::RepeatedField<unsigned_int>::InternalSwap(&this->channels_,&other->channels_);
  google::protobuf::RepeatedField<unsigned_int>::InternalSwap(&this->height_,&other->height_);
  google::protobuf::RepeatedField<unsigned_int>::InternalSwap(&this->width_,&other->width_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->shape_).super_RepeatedPtrFieldBase,&(other->shape_).super_RepeatedPtrFieldBase)
  ;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_0040d7c8;
LAB_0040d7b0:
    pUVar7 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_0040d7b0;
    pUVar7 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar5 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar5 & 1) == 0) {
    pUVar6 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar6 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  pvVar4 = pUVar6->fields_;
  pUVar6->fields_ = pUVar7->fields_;
  pUVar7->fields_ = pvVar4;
LAB_0040d7c8:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void DummyDataParameter::InternalSwap(DummyDataParameter* other) {
  data_filler_.InternalSwap(&other->data_filler_);
  num_.InternalSwap(&other->num_);
  channels_.InternalSwap(&other->channels_);
  height_.InternalSwap(&other->height_);
  width_.InternalSwap(&other->width_);
  shape_.InternalSwap(&other->shape_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}